

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bws.c
# Opt level: O0

int nn_bws_create(nn_ep *ep)

{
  int iVar1;
  nn_usock *tran;
  nn_bws *__s;
  size_t sVar2;
  char *pcVar3;
  nn_worker *in_RDI;
  size_t ipv4onlylen;
  int ipv4only;
  size_t sslen;
  sockaddr_storage ss;
  char *pos;
  char *end;
  char *addr;
  nn_bws *self;
  int rc;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  nn_usock *self_00;
  nn_bws *fn;
  nn_fsm *self_01;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  nn_ep *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  nn_bws *self_02;
  int local_4;
  
  tran = (nn_usock *)nn_alloc_(0x154659);
  if (tran == (nn_usock *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
            ,0x6e);
    fflush(_stderr);
    nn_err_abort();
  }
  tran->worker = in_RDI;
  nn_ep_tran_setup((nn_ep *)in_RDI,&nn_bws_ep_ops,tran);
  __s = (nn_bws *)nn_ep_getaddr((nn_ep *)in_RDI);
  self_02 = __s;
  sVar2 = strlen((char *)__s);
  fn = __s;
  pcVar3 = strrchr((char *)self_02,0x3a);
  if (pcVar3 == (char *)0x0) {
    local_4 = -0x16;
  }
  else {
    iVar1 = nn_port_resolve(pcVar3 + 1,(size_t)((long)__s + (sVar2 - (long)(pcVar3 + 1))));
    if (iVar1 < 0) {
      local_4 = -0x16;
    }
    else {
      self_01 = (nn_fsm *)0x4;
      nn_ep_getopt(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                   (void *)0x4,(size_t *)fn);
      if (self_01 != (nn_fsm *)0x4) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ipv4onlylen == sizeof (ipv4only)",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
                ,0x83);
        fflush(_stderr);
        nn_err_abort();
      }
      iVar1 = nn_iface_resolve(in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40,
                               in_stack_ffffffffffffff3c,(sockaddr_storage *)0x4,(size_t *)fn);
      if (iVar1 < 0) {
        local_4 = -0x13;
      }
      else {
        self_00 = tran;
        nn_ep_getctx((nn_ep *)0x1548aa);
        nn_fsm_init_root(self_01,(nn_fsm_fn)fn,(nn_fsm_fn)self_00,
                         (nn_ctx *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        tran->state = 1;
        *(undefined8 *)&tran[1].s = 0;
        nn_list_init((nn_list *)&tran[1].wfd);
        nn_fsm_start((nn_fsm *)0x154908);
        nn_usock_init(self_00,in_stack_ffffffffffffff1c,(nn_fsm *)0x154926);
        local_4 = nn_bws_listen(self_02);
        if (local_4 == 0) {
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int nn_bws_create (struct nn_ep *ep)
{
    int rc;
    struct nn_bws *self;
    const char *addr;
    const char *end;
    const char *pos;
    struct sockaddr_storage ss;
    size_t sslen;
    int ipv4only;
    size_t ipv4onlylen;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_bws), "bws");
    alloc_assert (self);
    self->ep = ep;

    nn_ep_tran_setup (ep, &nn_bws_ep_ops, self);
    addr = nn_ep_getaddr (ep);

    /*  Parse the port. */
    end = addr + strlen (addr);
    pos = strrchr (addr, ':');
    if (!pos) {
        return -EINVAL;
    }
    ++pos;
    rc = nn_port_resolve (pos, end - pos);
    if (rc < 0) {
        return -EINVAL;
    }

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_IPV4ONLY, &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    /*  Parse the address. */
    rc = nn_iface_resolve (addr, pos - addr - 1, ipv4only, &ss, &sslen);
    if (rc < 0) {
        return -ENODEV;
    }

    /*  Initialise the structure. */
    nn_fsm_init_root (&self->fsm, nn_bws_handler, nn_bws_shutdown,
        nn_ep_getctx (ep));
    self->state = NN_BWS_STATE_IDLE;
    self->aws = NULL;
    nn_list_init (&self->awss);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    nn_usock_init (&self->usock, NN_BWS_SRC_USOCK, &self->fsm);

    rc = nn_bws_listen (self);
    if (rc != 0) {
        return rc;
    }

    return 0;
}